

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O1

Cut_CMan_t * Cut_CManStart(void)

{
  uint *puVar1;
  Cut_CMan_t *__s;
  st__table *psVar2;
  Extra_MmFixed_t *pEVar3;
  uint uVar4;
  long lVar5;
  
  __s = (Cut_CMan_t *)malloc(0x1440);
  lVar5 = 0;
  memset(__s,0,0x1440);
  psVar2 = st__init_table(st__ptrcmp,st__ptrhash);
  __s->tTable = psVar2;
  pEVar3 = Extra_MmFixedStart(0x98);
  __s->pMem = pEVar3;
  do {
    uVar4 = 0;
    do {
      if ((uVar4 & 1 << ((byte)lVar5 & 0x1f)) != 0) {
        puVar1 = __s->uInputs[lVar5] + (uVar4 >> 5);
        *puVar1 = *puVar1 | 1 << ((byte)uVar4 & 0x1f);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x200);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 9);
  s_pCMan = __s;
  return __s;
}

Assistant:

Cut_CMan_t * Cut_CManStart()
{
    Cut_CMan_t * p;
    int i, k;
    // start the manager
    assert( sizeof(unsigned) == 4 );
    p = ABC_ALLOC( Cut_CMan_t, 1 );
    memset( p, 0, sizeof(Cut_CMan_t) );
    // start the table and the memory manager
    p->tTable = st__init_table( st__ptrcmp, st__ptrhash);;
    p->pMem = Extra_MmFixedStart( sizeof(Cut_Cell_t) );
    // set elementary truth tables
    for ( k = 0; k < CUT_CELL_MVAR; k++ )
        for ( i = 0; i < (1<<CUT_CELL_MVAR); i++ )
            if ( i & (1 << k) )
                p->uInputs[k][i>>5] |= (1 << (i&31));
    s_pCMan = p;
    return p;
}